

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::image_type_glsl_abi_cxx11_
          (CompilerMSL *this,SPIRType *type,uint32_t id,bool member)

{
  Dim DVar1;
  AccessQualifier AVar2;
  bool bVar3;
  uint32_t uVar4;
  CompilerError *pCVar5;
  size_t sVar6;
  SPIRType *pSVar7;
  ImageType *this_00;
  SPIRType *pSVar8;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  char *pcVar9;
  byte in_R8B;
  byte local_2f2;
  byte local_2f1;
  SPIRVariable *local_268;
  SPIRVariable *p_var;
  undefined4 local_23c;
  undefined1 local_238 [8];
  SPIRType img_type_4;
  bool subpass_array;
  ImageType *img_type;
  string img_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  char *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  char *local_60;
  char *descriptor_wrapper;
  SPIRType *pSStack_50;
  uint32_t array_size;
  SPIRType *parent;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t minor;
  uint32_t major;
  SPIRVariable *var;
  bool member_local;
  SPIRType *pSStack_20;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  pSStack_20 = (SPIRType *)CONCAT44(in_register_00000014,id);
  var._4_4_ = (uint32_t)CONCAT71(in_register_00000009,member);
  var._3_1_ = in_R8B & 1;
  type_local = type;
  this_local = this;
  _minor = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)type,var._4_4_);
  if ((_minor != (SPIRVariable *)0x0) &&
     (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_minor->basevariable), uVar4 != 0))
  {
    var._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&_minor->basevariable);
  }
  bVar3 = VectorView<unsigned_int>::empty(&(pSStack_20->array).super_VectorView<unsigned_int>);
  if (!bVar3) {
    local_34 = 2;
    local_38 = 0;
    bVar3 = Options::is_ios((Options *)
                            ((long)&type[0x1c].member_type_index_redirection.
                                    super_VectorView<unsigned_int>.ptr + 4));
    if (bVar3) {
      local_34 = 1;
      local_38 = 2;
    }
    bVar3 = Options::supports_msl_version
                      ((Options *)
                       ((long)&type[0x1c].member_type_index_redirection.
                               super_VectorView<unsigned_int>.ptr + 4),local_34,local_38,0);
    if (!bVar3) {
      bVar3 = Options::is_ios((Options *)
                              ((long)&type[0x1c].member_type_index_redirection.
                                      super_VectorView<unsigned_int>.ptr + 4));
      if (bVar3) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar5,"MSL 1.2 or greater is required for arrays of textures.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"MSL 2.0 or greater is required for arrays of textures.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    sVar6 = VectorView<unsigned_int>::size(&(pSStack_20->array).super_VectorView<unsigned_int>);
    if (1 < sVar6) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Arrays of arrays of textures are not supported in MSL.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    pSVar7 = Compiler::get_pointee_type((Compiler *)type,pSStack_20);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar7->parent_type);
    pSStack_50 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
    descriptor_wrapper._4_4_ = get_resource_array_size((CompilerMSL *)type,pSStack_20,var._4_4_);
    if (descriptor_wrapper._4_4_ == 0) {
      add_spv_func_and_recompile((CompilerMSL *)type,SPVFuncImplVariableDescriptor);
      add_spv_func_and_recompile((CompilerMSL *)type,SPVFuncImplVariableDescriptorArray);
      local_60 = "const spvDescriptorArray";
      if (((ulong)type[0x17].array_size_literal.super_VectorView<bool>.ptr & 1) != 0) {
        local_60 = "const device spvDescriptor";
      }
      if (((var._3_1_ & 1) != 0) &&
         (local_60 = "spvDescriptor", pSStack_20->basetype == SampledImage)) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar5,
                   "Argument buffer runtime array currently not supported for combined image sampler."
                  );
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      (*(type->super_IVariant)._vptr_IVariant[0x17])(local_80,type,pSStack_50,(ulong)var._4_4_,0);
      local_88 = "";
      if (((ulong)type[0x17].array_size_literal.super_VectorView<bool>.ptr & 1) != 0) {
        local_88 = "*";
      }
      join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2],char_const*>
                ((spirv_cross *)this,&local_60,(char (*) [2])0x421795,local_80,
                 (char (*) [2])0x4222ea,&local_88);
      ::std::__cxx11::string::~string((string *)local_80);
      return this;
    }
    (*(type->super_IVariant)._vptr_IVariant[0x17])(local_a8,type,pSStack_50,(ulong)var._4_4_,0);
    join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],unsigned_int&,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [7])0x412814,local_a8,(char (*) [3])0x421228,
               (uint *)((long)&descriptor_wrapper + 4),(char (*) [2])0x4222ea);
    ::std::__cxx11::string::~string((string *)local_a8);
    return this;
  }
  ::std::__cxx11::string::string((string *)&img_type);
  pSVar7 = pSStack_20;
  this_00 = &pSStack_20->image;
  bVar3 = Compiler::is_depth_image((Compiler *)type,pSStack_20,var._4_4_);
  if (bVar3) {
    DVar1 = (pSVar7->image).dim;
    if (DVar1 < Dim3D) {
      if (((pSVar7->image).dim == Dim1D) &&
         (((ulong)type[0x1c].member_name_cache._M_h._M_buckets & 0x100000000000000) == 0)) {
        ::std::__cxx11::string::operator+=((string *)&img_type,"depth1d_unsupported_by_metal");
      }
      else if ((((pSVar7->image).ms & 1U) == 0) || (((pSVar7->image).arrayed & 1U) == 0)) {
        if (((pSVar7->image).ms & 1U) == 0) {
          if (((pSVar7->image).arrayed & 1U) == 0) {
            ::std::__cxx11::string::operator+=((string *)&img_type,"depth2d");
          }
          else {
            ::std::__cxx11::string::operator+=((string *)&img_type,"depth2d_array");
          }
        }
        else {
          ::std::__cxx11::string::operator+=((string *)&img_type,"depth2d_ms");
        }
      }
      else {
        bVar3 = Options::supports_msl_version
                          ((Options *)
                           ((long)&type[0x1c].member_type_index_redirection.
                                   super_VectorView<unsigned_int>.ptr + 4),2,1,0);
        if (!bVar3) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Multisampled array textures are supported from 2.1.")
          ;
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,"depth2d_ms_array");
      }
    }
    else if (DVar1 == Dim3D) {
      ::std::__cxx11::string::operator+=((string *)&img_type,"depth3d_unsupported_by_metal");
    }
    else if (DVar1 == DimCube) {
      if (((ulong)type[0x1c].member_name_cache._M_h._M_before_begin._M_nxt & 0x1000000000000) == 0)
      {
        pcVar9 = "depthcube";
        if (((pSVar7->image).arrayed & 1U) != 0) {
          pcVar9 = "depthcube_array";
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,pcVar9);
      }
      else {
        pcVar9 = "depthcube";
        if (((pSVar7->image).arrayed & 1U) != 0) {
          pcVar9 = "depth2d_array";
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,pcVar9);
      }
    }
    else {
      ::std::__cxx11::string::operator+=((string *)&img_type,"unknown_depth_texture_type");
    }
  }
  else {
    switch((pSVar7->image).dim) {
    case Dim1D:
    case Dim2D:
    case DimSubpassData:
      local_2f1 = 0;
      if ((pSVar7->image).dim == DimSubpassData) {
        local_2f2 = 1;
        if (((ulong)type[0x1c].member_name_cache._M_h._M_buckets & 0x1000000) == 0) {
          local_2f2 = *(byte *)&type[0x1c].member_name_cache._M_h._M_rehash_policy.
                                _M_max_load_factor;
        }
        local_2f1 = local_2f2;
      }
      img_type_4.member_name_cache._M_h._M_single_bucket._7_1_ = local_2f1 & 1;
      if (((pSVar7->image).dim == Dim1D) &&
         (((ulong)type[0x1c].member_name_cache._M_h._M_buckets & 0x100000000000000) == 0)) {
        pcVar9 = "texture1d";
        if (((pSVar7->image).arrayed & 1U) != 0) {
          pcVar9 = "texture1d_array";
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,pcVar9);
      }
      else {
        bVar3 = type_is_msl_framebuffer_fetch((CompilerMSL *)type,pSStack_20);
        if (bVar3) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)this_00);
          pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
          SPIRType::SPIRType((SPIRType *)local_238,pSVar7);
          img_type_4.basetype = UByte;
          (*(type->super_IVariant)._vptr_IVariant[0x13])(this,type,local_238,0);
          local_23c = 1;
          SPIRType::~SPIRType((SPIRType *)local_238);
          goto LAB_00301f8b;
        }
        if ((((pSVar7->image).ms & 1U) == 0) ||
           ((((pSVar7->image).arrayed & 1U) == 0 &&
            ((img_type_4.member_name_cache._M_h._M_single_bucket._7_1_ & 1) == 0)))) {
          if (((pSVar7->image).ms & 1U) == 0) {
            if ((((pSVar7->image).arrayed & 1U) == 0) &&
               ((img_type_4.member_name_cache._M_h._M_single_bucket._7_1_ & 1) == 0)) {
              ::std::__cxx11::string::operator+=((string *)&img_type,"texture2d");
            }
            else {
              ::std::__cxx11::string::operator+=((string *)&img_type,"texture2d_array");
            }
          }
          else {
            ::std::__cxx11::string::operator+=((string *)&img_type,"texture2d_ms");
          }
        }
        else {
          bVar3 = Options::supports_msl_version
                            ((Options *)
                             ((long)&type[0x1c].member_type_index_redirection.
                                     super_VectorView<unsigned_int>.ptr + 4),2,1,0);
          if (!bVar3) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Multisampled array textures are supported from 2.1.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          ::std::__cxx11::string::operator+=((string *)&img_type,"texture2d_ms_array");
        }
      }
      break;
    case Dim3D:
      ::std::__cxx11::string::operator+=((string *)&img_type,"texture3d");
      break;
    case DimCube:
      if (((ulong)type[0x1c].member_name_cache._M_h._M_before_begin._M_nxt & 0x1000000000000) == 0)
      {
        pcVar9 = "texturecube";
        if (((pSVar7->image).arrayed & 1U) != 0) {
          pcVar9 = "texturecube_array";
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,pcVar9);
      }
      else {
        pcVar9 = "texturecube";
        if (((pSVar7->image).arrayed & 1U) != 0) {
          pcVar9 = "texture2d_array";
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,pcVar9);
      }
      break;
    default:
      ::std::__cxx11::string::operator+=((string *)&img_type,"unknown_texture_type");
      break;
    case DimBuffer:
      if ((((pSVar7->image).ms & 1U) != 0) || (((pSVar7->image).arrayed & 1U) != 0)) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar5,"Cannot use texel buffers with multisampling or array layers.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((type[0x1c].member_name_cache._M_h._M_element_count & 1) == 0) {
        ::std::__cxx11::string::operator+=((string *)&img_type,"texture2d");
      }
      else {
        bVar3 = Options::supports_msl_version
                          ((Options *)
                           ((long)&type[0x1c].member_type_index_redirection.
                                   super_VectorView<unsigned_int>.ptr + 4),2,1,0);
        if (!bVar3) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar5,"Native texture_buffer type is only supported in MSL 2.1.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::__cxx11::string::operator=((string *)&img_type,"texture_buffer");
      }
    }
  }
  ::std::__cxx11::string::operator+=((string *)&img_type,"<");
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)this_00);
  pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
  (*(type->super_IVariant)._vptr_IVariant[0x13])(&p_var,type,pSVar8,0);
  ::std::__cxx11::string::operator+=((string *)&img_type,(string *)&p_var);
  ::std::__cxx11::string::~string((string *)&p_var);
  if (((pSStack_20->basetype == Image) && ((pSStack_20->image).sampled == 2)) &&
     ((pSStack_20->image).dim != DimSubpassData)) {
    AVar2 = (pSVar7->image).access;
    if (AVar2 == AccessQualifierReadOnly) {
      ::std::__cxx11::string::operator+=((string *)&img_type,", access::read");
    }
    else if (AVar2 == AccessQualifierWriteOnly) {
      ::std::__cxx11::string::operator+=((string *)&img_type,", access::write");
    }
    else if (AVar2 == AccessQualifierReadWrite) {
      ::std::__cxx11::string::operator+=((string *)&img_type,", access::read_write");
    }
    else {
      local_268 = Compiler::maybe_get_backing_variable((Compiler *)type,var._4_4_);
      if ((local_268 != (SPIRVariable *)0x0) &&
         (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_268->basevariable),
         uVar4 != 0)) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_268->basevariable);
        local_268 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)type,uVar4);
      }
      if ((local_268 != (SPIRVariable *)0x0) &&
         (bVar3 = Compiler::has_decoration
                            ((Compiler *)type,(ID)(local_268->super_IVariant).self.id,
                             DecorationNonWritable), !bVar3)) {
        ::std::__cxx11::string::operator+=((string *)&img_type,", access::");
        bVar3 = Compiler::has_decoration
                          ((Compiler *)type,(ID)(local_268->super_IVariant).self.id,
                           DecorationNonReadable);
        if (!bVar3) {
          ::std::__cxx11::string::operator+=((string *)&img_type,"read_");
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,"write");
      }
    }
  }
  ::std::__cxx11::string::operator+=((string *)&img_type,">");
  ::std::__cxx11::string::string((string *)this,(string *)&img_type);
  local_23c = 1;
LAB_00301f8b:
  ::std::__cxx11::string::~string((string *)&img_type);
  return this;
}

Assistant:

string CompilerMSL::image_type_glsl(const SPIRType &type, uint32_t id, bool member)
{
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->basevariable)
	{
		// For comparison images, check against the base variable,
		// and not the fake ID which might have been generated for this variable.
		id = var->basevariable;
	}

	if (!type.array.empty())
	{
		uint32_t major = 2, minor = 0;
		if (msl_options.is_ios())
		{
			major = 1;
			minor = 2;
		}
		if (!msl_options.supports_msl_version(major, minor))
		{
			if (msl_options.is_ios())
				SPIRV_CROSS_THROW("MSL 1.2 or greater is required for arrays of textures.");
			else
				SPIRV_CROSS_THROW("MSL 2.0 or greater is required for arrays of textures.");
		}

		if (type.array.size() > 1)
			SPIRV_CROSS_THROW("Arrays of arrays of textures are not supported in MSL.");

		// Arrays of images in MSL must be declared with a special array<T, N> syntax ala C++11 std::array.
		// If we have a runtime array, it could be a variable-count descriptor set binding.
		auto &parent = get<SPIRType>(get_pointee_type(type).parent_type);
		uint32_t array_size = get_resource_array_size(type, id);

		if (array_size == 0)
		{
			add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
			add_spv_func_and_recompile(SPVFuncImplVariableDescriptorArray);
			const char *descriptor_wrapper = processing_entry_point ? "const device spvDescriptor" : "const spvDescriptorArray";
			if (member)
			{
				descriptor_wrapper = "spvDescriptor";
				// This requires a specialized wrapper type that packs image and sampler side by side.
				// It is possible in theory.
				if (type.basetype == SPIRType::SampledImage)
					SPIRV_CROSS_THROW("Argument buffer runtime array currently not supported for combined image sampler.");
			}
			return join(descriptor_wrapper, "<", image_type_glsl(parent, id, false), ">",
			            processing_entry_point ? "*" : "");
		}
		else
		{
			return join("array<", image_type_glsl(parent, id, false), ", ", array_size, ">");
		}
	}

	string img_type_name;

	auto &img_type = type.image;

	if (is_depth_image(type, id))
	{
		switch (img_type.dim)
		{
		case Dim1D:
		case Dim2D:
			if (img_type.dim == Dim1D && !msl_options.texture_1D_as_2D)
			{
				// Use a native Metal 1D texture
				img_type_name += "depth1d_unsupported_by_metal";
				break;
			}

			if (img_type.ms && img_type.arrayed)
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Multisampled array textures are supported from 2.1.");
				img_type_name += "depth2d_ms_array";
			}
			else if (img_type.ms)
				img_type_name += "depth2d_ms";
			else if (img_type.arrayed)
				img_type_name += "depth2d_array";
			else
				img_type_name += "depth2d";
			break;
		case Dim3D:
			img_type_name += "depth3d_unsupported_by_metal";
			break;
		case DimCube:
			if (!msl_options.emulate_cube_array)
				img_type_name += (img_type.arrayed ? "depthcube_array" : "depthcube");
			else
				img_type_name += (img_type.arrayed ? "depth2d_array" : "depthcube");
			break;
		default:
			img_type_name += "unknown_depth_texture_type";
			break;
		}
	}
	else
	{
		switch (img_type.dim)
		{
		case DimBuffer:
			if (img_type.ms || img_type.arrayed)
				SPIRV_CROSS_THROW("Cannot use texel buffers with multisampling or array layers.");

			if (msl_options.texture_buffer_native)
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Native texture_buffer type is only supported in MSL 2.1.");
				img_type_name = "texture_buffer";
			}
			else
				img_type_name += "texture2d";
			break;
		case Dim1D:
		case Dim2D:
		case DimSubpassData:
		{
			bool subpass_array =
			    img_type.dim == DimSubpassData && (msl_options.multiview || msl_options.arrayed_subpass_input);
			if (img_type.dim == Dim1D && !msl_options.texture_1D_as_2D)
			{
				// Use a native Metal 1D texture
				img_type_name += (img_type.arrayed ? "texture1d_array" : "texture1d");
				break;
			}

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			if (type_is_msl_framebuffer_fetch(type))
			{
				auto img_type_4 = get<SPIRType>(img_type.type);
				img_type_4.vecsize = 4;
				return type_to_glsl(img_type_4);
			}
			if (img_type.ms && (img_type.arrayed || subpass_array))
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Multisampled array textures are supported from 2.1.");
				img_type_name += "texture2d_ms_array";
			}
			else if (img_type.ms)
				img_type_name += "texture2d_ms";
			else if (img_type.arrayed || subpass_array)
				img_type_name += "texture2d_array";
			else
				img_type_name += "texture2d";
			break;
		}
		case Dim3D:
			img_type_name += "texture3d";
			break;
		case DimCube:
			if (!msl_options.emulate_cube_array)
				img_type_name += (img_type.arrayed ? "texturecube_array" : "texturecube");
			else
				img_type_name += (img_type.arrayed ? "texture2d_array" : "texturecube");
			break;
		default:
			img_type_name += "unknown_texture_type";
			break;
		}
	}

	// Append the pixel type
	img_type_name += "<";
	img_type_name += type_to_glsl(get<SPIRType>(img_type.type));

	// For unsampled images, append the sample/read/write access qualifier.
	// For kernel images, the access qualifier my be supplied directly by SPIR-V.
	// Otherwise it may be set based on whether the image is read from or written to within the shader.
	if (type.basetype == SPIRType::Image && type.image.sampled == 2 && type.image.dim != DimSubpassData)
	{
		switch (img_type.access)
		{
		case AccessQualifierReadOnly:
			img_type_name += ", access::read";
			break;

		case AccessQualifierWriteOnly:
			img_type_name += ", access::write";
			break;

		case AccessQualifierReadWrite:
			img_type_name += ", access::read_write";
			break;

		default:
		{
			auto *p_var = maybe_get_backing_variable(id);
			if (p_var && p_var->basevariable)
				p_var = maybe_get<SPIRVariable>(p_var->basevariable);
			if (p_var && !has_decoration(p_var->self, DecorationNonWritable))
			{
				img_type_name += ", access::";

				if (!has_decoration(p_var->self, DecorationNonReadable))
					img_type_name += "read_";

				img_type_name += "write";
			}
			break;
		}
		}
	}

	img_type_name += ">";

	return img_type_name;
}